

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int lhCursorDelete(unqlite_kv_cursor *pCursor)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  lhash_kv_engine *pEngine;
  byte *pbVar7;
  bool bVar8;
  int iVar9;
  lhcell *pCell;
  ulong uVar10;
  lhash_kv_cursor *pCur;
  pgno pVar11;
  ulong uVar12;
  unqlite_page *pOvfl;
  unqlite_page *local_50;
  lhcell *local_48;
  ulong local_40;
  ulong local_38;
  
  iVar9 = -9;
  if ((*(int *)&pCursor[1].pStore == 2) &&
     (pCell = (lhcell *)pCursor[2].pStore, pCell != (lhcell *)0x0)) {
    pCursor[2].pStore = (unqlite_kv_engine *)pCell->pNext;
    pVar11 = pCell->iOvfl;
    if (pVar11 != 0) {
      pEngine = pCell->pPage->pHash;
      local_48 = pCell;
      do {
        iVar9 = (*pEngine->pIo->xGet)(pEngine->pIo->pHandle,pVar11,&local_50);
        if (iVar9 != 0) {
LAB_0011264d:
          bVar8 = false;
          goto LAB_0011264f;
        }
        pbVar7 = local_50->zData;
        local_40 = (ulong)pbVar7[7];
        bVar1 = pbVar7[6];
        bVar2 = pbVar7[5];
        bVar3 = pbVar7[4];
        bVar4 = pbVar7[3];
        bVar5 = pbVar7[2];
        local_38 = (ulong)pbVar7[1];
        bVar6 = *pbVar7;
        iVar9 = lhRestorePage(pEngine,local_50);
        if (iVar9 != 0) goto LAB_0011264d;
        uVar12 = (ulong)bVar1 * 0x100 + local_40;
        uVar10 = local_38 << 0x30;
        iVar9 = (*pEngine->pIo->xPageUnref)(local_50);
        pVar11 = (ulong)bVar6 << 0x38 |
                 uVar10 | (ulong)bVar5 << 0x28 |
                          (ulong)bVar4 << 0x20 |
                          (ulong)bVar3 << 0x18 | (ulong)bVar2 << 0x10 | uVar12;
      } while (pVar11 != 0);
      bVar8 = true;
LAB_0011264f:
      pCell = local_48;
      if (!bVar8) {
        return iVar9;
      }
    }
    iVar9 = lhUnlinkCell(pCell);
  }
  return iVar9;
}

Assistant:

static int lhCursorDelete(unqlite_kv_cursor *pCursor)
{
	lhash_kv_cursor *pCur = (lhash_kv_cursor *)pCursor;
	lhcell *pCell;
	int rc;
	if( pCur->iState != L_HASH_CURSOR_STATE_CELL || pCur->pCell == 0 ){
		/* Invalid state */
		return UNQLITE_INVALID;
	}
	/* Point to the target cell  */
	pCell = pCur->pCell;
	/* Point to the next entry */
	pCur->pCell = pCell->pNext;
	/* Perform the deletion */
	rc = lhRecordRemove(pCell);
	return rc;
}